

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O2

size_t __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::insert
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this,size_t index,C *p,size_t length
          )

{
  BufHdr *p_00;
  C *dst;
  EVP_PKEY_CTX *src;
  size_t sVar1;
  Ptr<void> shadow;
  Ptr<void> local_38;
  
  sVar1 = (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length;
  if (length == 0xffffffffffffffff) {
    length = StringDetailsBase<char>::calcLength(p);
  }
  if (length != 0) {
    shadow.m_p = (void *)0x0;
    shadow.m_refCount = (RefCount *)0x0;
    p_00 = (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_hdr;
    if (((p_00 != (BufHdr *)0x0) && (p_00 + 1 <= p)) &&
       (p < (C *)((long)&p_00[1].super_RefCount._vptr_RefCount + p_00->m_bufferSize))) {
      rc::Ptr<void>::Ptr<axl::rc::BufHdr>(&local_38,p_00);
      rc::Ptr<void>::copy(&shadow,(EVP_PKEY_CTX *)&local_38,src);
      rc::Ptr<void>::~Ptr(&local_38);
    }
    dst = insertSpace(this,index,length);
    if (dst == (C *)0x0) {
      sVar1 = 0xffffffffffffffff;
    }
    else {
      __wrap_memcpy(dst,p,length);
      sVar1 = sVar1 + length;
    }
    rc::Ptr<void>::~Ptr(&shadow);
  }
  return sVar1;
}

Assistant:

size_t
	insert(
		size_t index,
		const C* p,
		size_t length = -1
	) {
		size_t oldLength = this->m_length;

		if (length == -1)
			length = Details::calcLength(p);

		if (length == 0)
			return oldLength;

		rc::Ptr<void> shadow;
		if (this->m_hdr && this->m_hdr->isInsideBuffer(p))
			shadow = this->m_hdr; // ensure we keep p intact

		C* dst = insertSpace(index, length);
		if (!dst)
			return -1;

		Details::copy(dst, p, length);
		return oldLength + length;
	}